

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
notch::io::CSVReader::readCSVRow
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CSVReader *this,string *row)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  size_type sVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_59;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  __l._M_len = 1;
  __l._M_array = &local_50;
  core::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_59);
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  sVar2 = row->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (row->_M_dataplus)._M_p;
    sVar6 = 0;
    iVar4 = 0;
    lVar5 = 0;
    do {
      cVar1 = pcVar3[sVar6];
      if (iVar4 == 2) {
        if (cVar1 == this->delimiter) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_50);
LAB_0011655b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          lVar5 = lVar5 + 1;
        }
        else if (cVar1 == '\"') goto LAB_0011657a;
LAB_001165b8:
        iVar4 = 0;
      }
      else if (iVar4 == 1) {
        iVar4 = 2;
        if (cVar1 != '\"') {
LAB_0011657a:
          iVar4 = 1;
          std::__cxx11::string::push_back((char)(lVar5 << 5) + (char)*(undefined8 *)local_58);
        }
      }
      else {
        if (cVar1 == this->delimiter) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_50);
          goto LAB_0011655b;
        }
        iVar4 = 1;
        if (cVar1 != '\"') {
          std::__cxx11::string::push_back((char)(lVar5 << 5) + (char)*(undefined8 *)local_58);
          goto LAB_001165b8;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_58;
}

Assistant:

std::vector<std::string> readCSVRow(const std::string &row) {
        CSVReaderState state = CSVReaderState::UnquotedField;
        std::vector<std::string> fields {""};
        size_t i = 0; // index of the current field
        for (char c : row) {
            switch (state) {
                case CSVReaderState::UnquotedField:
                    if (c == delimiter) { // end of field
                          fields.push_back(""); i++;
                    } else if (c == '"') {
                        state = CSVReaderState::QuotedField;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedField:
                    if (c == '"') {
                        state = CSVReaderState::QuotedQuote;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedQuote:
                    if (c == delimiter) { // , after closing quote
                          fields.push_back(""); i++;
                          state = CSVReaderState::UnquotedField;
                    } else if (c == '"') { // "" -> "
                          fields[i].push_back('"');
                          state = CSVReaderState::QuotedField;
                    } else { // end of quote
                          state = CSVReaderState::UnquotedField;
                    }
                    break;
            }
        }
        return fields;
    }